

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * get_file(string *__return_storage_ptr__,string *message)

{
  string *this;
  string sStack_58;
  string data;
  
  this = (string *)operator_new(0x20);
  FileManager::FileManager((FileManager *)this);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sStack_58,(string *)message);
  FileManager::get_file(__return_storage_ptr__,(FileManager *)this,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string(this);
  operator_delete(this,0x20);
  std::__cxx11::string::~string((string *)&data);
  return __return_storage_ptr__;
}

Assistant:

std::string get_file(const std::string &message) {
    auto f = new FileManager;
    std::string data;
    auto result = f->get_file(message);
    delete f;
    return result;
}